

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffghpr(fitsfile *fptr,int maxdim,int *simple,int *bitpix,int *naxis,long *naxes,long *pcount,
          long *gcount,int *extend,int *status)

{
  int in_ESI;
  int *in_R8;
  long in_R9;
  int *in_stack_00000020;
  LONGLONG tnaxes [99];
  double ddummy;
  LONGLONG lldummy;
  int ii;
  int idummy;
  undefined8 local_388 [69];
  LONGLONG *in_stack_fffffffffffffea0;
  int *in_stack_fffffffffffffea8;
  int *in_stack_fffffffffffffeb0;
  int *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec4;
  fitsfile *in_stack_fffffffffffffec8;
  long *in_stack_fffffffffffffee0;
  long *in_stack_fffffffffffffee8;
  int *in_stack_fffffffffffffef0;
  double *in_stack_fffffffffffffef8;
  double *in_stack_ffffffffffffff00;
  LONGLONG *in_stack_ffffffffffffff08;
  int *in_stack_ffffffffffffff10;
  int *in_stack_ffffffffffffff18;
  int local_58;
  
  ffgphd(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8,
         in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
         in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,in_stack_fffffffffffffef0,
         in_stack_fffffffffffffef8,in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,
         in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
  if ((in_R8 == (int *)0x0) || (in_R9 == 0)) {
    if (in_R9 != 0) {
      for (local_58 = 0; local_58 < in_ESI; local_58 = local_58 + 1) {
        *(undefined8 *)(in_R9 + (long)local_58 * 8) = local_388[local_58];
      }
    }
  }
  else {
    for (local_58 = 0; local_58 < *in_R8 && local_58 < in_ESI; local_58 = local_58 + 1) {
      *(undefined8 *)(in_R9 + (long)local_58 * 8) = local_388[local_58];
    }
  }
  return *in_stack_00000020;
}

Assistant:

int ffghpr(fitsfile *fptr,  /* I - FITS file pointer                        */
           int maxdim,      /* I - maximum no. of dimensions to read;       */
           int *simple,     /* O - does file conform to FITS standard? 1/0  */
           int *bitpix,     /* O - number of bits per data value pixel      */
           int *naxis,      /* O - number of axes in the data array         */
           long naxes[],    /* O - length of each data axis                 */
           long *pcount,    /* O - number of group parameters (usually 0)   */
           long *gcount,    /* O - number of random groups (usually 1 or 0) */
           int *extend,     /* O - may FITS file haave extensions?          */
           int *status)     /* IO - error status                            */
/*
  Get keywords from the Header of the PRimary array:
  Check that the keywords conform to the FITS standard and return the
  parameters which determine the size and structure of the primary array
  or IMAGE extension.
*/
{
    int idummy, ii;
    LONGLONG lldummy;
    double ddummy;
    LONGLONG tnaxes[99];

    ffgphd(fptr, maxdim, simple, bitpix, naxis, tnaxes, pcount, gcount, extend,
          &ddummy, &ddummy, &lldummy, &idummy, status);
	  
    if (naxis && naxes) {
         for (ii = 0; (ii < *naxis) && (ii < maxdim); ii++)
	     naxes[ii] = (long) tnaxes[ii];
    } else if (naxes) {
         for (ii = 0; ii < maxdim; ii++)
	     naxes[ii] = (long) tnaxes[ii];
    }

    return(*status);
}